

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O1

SRes SzReadHeader(CSzArEx *p,CSzData *sd,ILookInStream *inStream,ISzAlloc *allocMain,
                 ISzAlloc *allocTemp)

{
  ulong *puVar1;
  Byte BVar2;
  ulong uVar3;
  byte bVar4;
  undefined3 uVar5;
  SRes SVar6;
  SRes SVar7;
  SRes SVar8;
  uint uVar9;
  size_t *psVar10;
  UInt32 *pUVar11;
  UInt32 *pUVar12;
  UInt64 *pUVar13;
  Byte *pBVar14;
  UInt32 UVar15;
  undefined4 uVar16;
  Byte *pBVar17;
  ulong uVar18;
  byte *pbVar19;
  CSzData *pCVar20;
  CSzBitUi64s *p_00;
  uint uVar21;
  byte bVar22;
  undefined4 in_R11D;
  undefined3 uVar23;
  UInt64 UVar24;
  ulong uVar25;
  int __result__;
  int iVar26;
  long lVar27;
  ulong uVar28;
  char cVar29;
  bool bVar30;
  UInt32 *local_1e0;
  UInt32 numFiles;
  undefined8 local_1c8;
  uint local_1bc;
  undefined8 local_1b8;
  Byte *local_1b0;
  ulong local_1a8;
  UInt64 type_2;
  UInt64 *local_198;
  CSzBitUi32s *local_190;
  UInt64 type;
  ulong local_180;
  CSzData *local_178;
  CSzBitUi64s *local_170;
  Byte *local_168;
  Byte *local_160;
  byte *local_158;
  UInt32 index_1;
  CSubStreamInfo local_148;
  UInt64 size;
  UInt64 type_1;
  UInt64 *pUStack_100;
  Byte *local_f8;
  UInt32 *pUStack_f0;
  size_t *local_e8;
  UInt32 *pUStack_e0;
  UInt32 *local_d8;
  Byte *pBStack_d0;
  UInt64 *local_c8;
  Byte *pBStack_c0;
  CBuf tempBufs [8];
  
  lVar27 = 0;
  do {
    Buf_Init((CBuf *)((long)&tempBufs[0].data + lVar27));
    lVar27 = lVar27 + 0x10;
  } while (lVar27 != 0x80);
  numFiles = 0;
  local_148.sdSizes.Size = 0;
  local_148.sdCRCs.Data = (Byte *)0x0;
  local_148.sdNumSubStreams.Size = 0;
  local_148.sdSizes.Data = (Byte *)0x0;
  local_148.NumTotalSubStreams = 0;
  local_148.NumSubDigests = 0;
  local_148.sdNumSubStreams.Data = (Byte *)0x0;
  local_148.sdCRCs.Size = 0;
  SVar6 = ReadNumber(sd,&type);
  SVar7 = SVar6;
  if (SVar6 != 0) goto LAB_00708679;
  if (type == 2) {
    do {
      SVar7 = ReadNumber(sd,&type_1);
      cVar29 = '\x01';
      if (SVar7 == 0) {
        SVar7 = SVar6;
        if (type_1 == 0) {
          cVar29 = '\x02';
        }
        else {
          SVar6 = SkipData(sd);
          cVar29 = SVar6 != 0;
          if ((bool)cVar29) {
            SVar7 = SVar6;
          }
        }
      }
      SVar6 = SVar7;
    } while (cVar29 == '\0');
    SVar7 = SVar6;
    if ((cVar29 != '\x02') || (SVar7 = ReadNumber(sd,&type), SVar7 != 0)) goto LAB_00708679;
  }
  if (type == 3) {
    local_c8 = (UInt64 *)0x0;
    pBStack_c0 = (Byte *)0x0;
    local_d8 = (UInt32 *)0x0;
    pBStack_d0 = (Byte *)0x0;
    local_e8 = (size_t *)0x0;
    pUStack_e0 = (UInt32 *)0x0;
    local_f8 = (Byte *)0x0;
    pUStack_f0 = (UInt32 *)0x0;
    type_1 = 0;
    pUStack_100 = (UInt64 *)0x0;
    SVar7 = SzReadAndDecodePackedStreams
                      (inStream,sd,tempBufs,8,p->startPosAfterHeader,(CSzAr *)&type_1,allocTemp);
    local_1c8 = (UInt32 *)CONCAT44(local_1c8._4_4_,type_1._4_4_);
    SzAr_Free((CSzAr *)&type_1,allocTemp);
    if (SVar7 == 0) {
      SVar7 = ReadNumber(sd,&type);
      bVar30 = SVar7 == 0;
      if (!bVar30) {
        SVar6 = SVar7;
      }
    }
    else {
      bVar30 = false;
      SVar6 = SVar7;
    }
    SVar7 = SVar6;
    if (!bVar30) goto LAB_00708679;
  }
  else {
    local_1c8 = (UInt32 *)((ulong)local_1c8._4_4_ << 0x20);
  }
  if (type == 4) {
    SVar7 = SzReadStreamsInfo(&p->db,sd,0x40000000,tempBufs,(UInt32)local_1c8,&p->dataPos,&local_148
                              ,allocMain);
    if (SVar7 != 0) goto LAB_00708679;
    p->dataPos = p->dataPos + p->startPosAfterHeader;
    SVar7 = ReadNumber(sd,&type);
    if (SVar7 != 0) goto LAB_00708679;
  }
  if (type == 0) {
    SVar7 = 0;
    goto LAB_00708679;
  }
  if (type != 5) {
LAB_00709326:
    SVar7 = 0x10;
    goto LAB_00708679;
  }
  SVar7 = SzReadNumber32(sd,&numFiles);
  if (SVar7 != 0) goto LAB_00708679;
  p->NumFiles = numFiles;
  local_1b8 = &p->CTime;
  local_170 = &p->MTime;
  local_190 = &p->Attribs;
  local_158 = (byte *)0x0;
  local_168 = (Byte *)0x0;
  local_1a8 = 0;
  do {
    SVar7 = ReadNumber(sd,&type_2);
    uVar21 = (uint)type_2;
    cVar29 = '\x01';
    if (SVar7 != 0) goto LAB_007088f3;
    uVar28 = CONCAT44(type_2._4_4_,(uint)type_2);
    if (uVar28 == 0) {
      cVar29 = '\x04';
      SVar7 = SVar6;
      goto LAB_007088f3;
    }
    SVar7 = ReadNumber(sd,&size);
    if (SVar7 != 0) goto LAB_007088f3;
    uVar25 = sd->Size;
    if (uVar25 < size) {
      SVar7 = 0x10;
      goto LAB_007088f3;
    }
    if (0xff < uVar28) {
switchD_00708970_caseD_10:
      sd->Size = uVar25 - size;
      sd->Data = sd->Data + size;
      goto LAB_00708951;
    }
    switch(uVar21 & 0xff) {
    case 0xe:
      uVar28 = (ulong)(numFiles + 7 >> 3);
      SVar7 = 0x10;
      if (uVar25 < uVar28) break;
      local_158 = sd->Data;
      sd->Size = uVar25 - uVar28;
      sd->Data = local_158 + uVar28;
      if (numFiles == 0) {
        local_1a8 = 0;
      }
      else {
        local_1a8 = 0;
        uVar21 = 0;
        bVar22 = 0;
        pbVar19 = local_158;
        UVar15 = numFiles;
        do {
          if (uVar21 == 0) {
            bVar22 = *pbVar19;
            pbVar19 = pbVar19 + 1;
            uVar21 = 8;
          }
          uVar21 = uVar21 - 1;
          local_1a8 = (ulong)((int)local_1a8 + (uint)((bVar22 >> (uVar21 & 0x1f) & 1) != 0));
          UVar15 = UVar15 - 1;
        } while (UVar15 != 0);
      }
      local_168 = (Byte *)0x0;
      goto LAB_00708951;
    case 0xf:
      uVar28 = (ulong)((int)local_1a8 + 7U >> 3);
      SVar7 = 0x10;
      if (uVar28 <= uVar25) {
        local_168 = sd->Data;
        sd->Size = uVar25 - uVar28;
        sd->Data = local_168 + uVar28;
        goto LAB_00708951;
      }
      break;
    default:
      goto switchD_00708970_caseD_10;
    case 0x11:
      SVar7 = 0x10;
      cVar29 = '\x01';
      if (uVar25 == 0) goto LAB_00708cef;
      sd->Size = uVar25 - 1;
      pBVar17 = sd->Data;
      pBVar14 = pBVar17 + 1;
      sd->Data = pBVar14;
      BVar2 = *pBVar17;
      local_1bc = CONCAT31(local_1bc._1_3_,BVar2);
      if (BVar2 == '\0') {
        local_198 = (UInt64 *)(size - 1);
        local_1b0 = pBVar14;
        SVar8 = SVar6;
LAB_00708c39:
        if (((ulong)local_198 & 1) == 0) {
          local_180 = (ulong)numFiles;
          psVar10 = (size_t *)(*allocMain->Alloc)(allocMain,(ulong)(numFiles + 1) << 3);
          p->FileNameOffsets = psVar10;
          SVar7 = 2;
          if (psVar10 != (size_t *)0x0) {
            pBVar14 = (Byte *)(*allocMain->Alloc)(allocMain,(size_t)local_198);
            pUVar13 = local_198;
            p->FileNames = pBVar14;
            if (pBVar14 != (Byte *)0x0) {
              memcpy(pBVar14,local_1b0,(size_t)local_198);
              SVar6 = SzReadFileNames(p->FileNames,(size_t)pUVar13,(UInt32)local_180,
                                      p->FileNameOffsets);
              if (SVar6 != 0) goto LAB_00708d01;
              cVar29 = '\x06';
              bVar30 = true;
              SVar6 = SVar8;
              if ((char)local_1bc == '\0') {
                sd->Size = sd->Size - (long)local_198;
                sd->Data = sd->Data + (long)local_198;
              }
              goto LAB_00708d06;
            }
          }
LAB_00708cef:
          bVar30 = false;
          SVar6 = SVar7;
          cVar29 = '\x01';
        }
        else {
          bVar30 = false;
          SVar6 = SVar7;
          cVar29 = '\x01';
        }
      }
      else {
        SVar8 = SzReadNumber32(sd,(UInt32 *)&type_1);
        if (SVar8 == 0) {
          if ((UInt32)local_1c8 <= (uint)type_1) {
            SVar8 = 0x10;
            goto LAB_00708c22;
          }
          local_1b0 = tempBufs[type_1 & 0xffffffff].data;
          local_198 = (UInt64 *)tempBufs[type_1 & 0xffffffff].size;
          bVar30 = true;
        }
        else {
LAB_00708c22:
          SVar6 = SVar8;
          bVar30 = false;
        }
        SVar8 = SVar6;
        if (bVar30) goto LAB_00708c39;
LAB_00708d01:
        bVar30 = false;
      }
LAB_00708d06:
      SVar7 = SVar6;
      if (bVar30) goto LAB_00708951;
      break;
    case 0x12:
      p_00 = local_1b8;
      goto LAB_00708af7;
    case 0x14:
      p_00 = local_170;
LAB_00708af7:
      SVar7 = ReadTime(p_00,numFiles,sd,tempBufs,(UInt32)local_1c8,allocMain);
      if (SVar7 == 0) {
LAB_00708951:
        cVar29 = '\0';
        SVar7 = SVar6;
      }
      break;
    case 0x15:
      (*allocMain->Free)(allocMain,(p->Attribs).Defs);
      (p->Attribs).Defs = (Byte *)0x0;
      (*allocMain->Free)(allocMain,(p->Attribs).Vals);
      (p->Attribs).Vals = (UInt32 *)0x0;
      local_1bc = numFiles;
      SVar7 = ReadBitVector(sd,numFiles,&local_190->Defs,allocMain);
      uVar21 = local_1bc;
      cVar29 = '\x01';
      if (SVar7 == 0) {
        if (sd->Size == 0) {
          SVar7 = 0x10;
          goto LAB_00708a94;
        }
        sd->Size = sd->Size - 1;
        pBVar14 = sd->Data;
        sd->Data = pBVar14 + 1;
        pCVar20 = sd;
        if (*pBVar14 != '\0') {
          SVar7 = SzReadNumber32(sd,&index_1);
          if (SVar7 == 0) {
            if ((UInt32)local_1c8 <= index_1) {
              SVar7 = 0x10;
              goto LAB_00708d1b;
            }
            type_1 = (UInt64)tempBufs[index_1].data;
            pUStack_100 = (UInt64 *)tempBufs[index_1].size;
            bVar30 = true;
            local_178 = (CSzData *)&type_1;
          }
          else {
LAB_00708d1b:
            SVar6 = SVar7;
            bVar30 = false;
          }
          pCVar20 = local_178;
          SVar7 = SVar6;
          if (!bVar30) goto LAB_00708a94;
        }
        local_178 = pCVar20;
        SVar7 = ReadUi32s(pCVar20,uVar21,local_190,allocMain);
        bVar30 = SVar7 == 0;
        if (!bVar30) {
          SVar6 = SVar7;
        }
        cVar29 = bVar30 * '\x05' + '\x01';
      }
      else {
LAB_00708a94:
        bVar30 = false;
        SVar6 = SVar7;
      }
      SVar7 = SVar6;
      if (bVar30) goto LAB_00708951;
    }
LAB_007088f3:
    SVar6 = SVar7;
  } while (cVar29 == '\0');
  SVar7 = SVar6;
  if (cVar29 != '\x04') goto LAB_00708679;
  pUVar12 = (UInt32 *)(ulong)numFiles;
  SVar7 = 0x10;
  if (numFiles - (int)local_1a8 != local_148.NumTotalSubStreams) goto LAB_00708679;
  do {
    SVar7 = ReadNumber(sd,&type_1);
    cVar29 = '\x01';
    if (SVar7 == 0) {
      SVar7 = SVar6;
      if (type_1 == 0) {
        cVar29 = '\a';
      }
      else {
        SVar6 = SkipData(sd);
        cVar29 = SVar6 != 0;
        if ((bool)cVar29) {
          SVar7 = SVar6;
        }
      }
    }
    SVar6 = SVar7;
  } while (cVar29 == '\0');
  SVar7 = SVar6;
  if (cVar29 != '\a') goto LAB_00708679;
  type_2._0_4_ = 0;
  pUVar11 = (UInt32 *)(*allocMain->Alloc)(allocMain,(ulong)((p->db).NumFolders + 1) << 2);
  p->FolderToFile = pUVar11;
  SVar7 = 2;
  if (pUVar11 == (UInt32 *)0x0) goto LAB_00708679;
  local_1c8 = pUVar12;
  if ((ulong)p->NumFiles == 0) {
    p->FileToFolder = (UInt32 *)0x0;
  }
  else {
    pUVar12 = (UInt32 *)(*allocMain->Alloc)(allocMain,(ulong)p->NumFiles << 2);
    p->FileToFolder = pUVar12;
    if (pUVar12 == (UInt32 *)0x0) goto LAB_00708679;
  }
  pUVar13 = (UInt64 *)(*allocMain->Alloc)(allocMain,(ulong)(p->NumFiles + 1) << 3);
  p->UnpackPositions = pUVar13;
  if (pUVar13 == (UInt64 *)0x0) goto LAB_00708679;
  if (p->NumFiles + 7 < 8) {
    p->IsDirs = (Byte *)0x0;
  }
  else {
    pBVar14 = (Byte *)(*allocMain->Alloc)(allocMain,0);
    p->IsDirs = pBVar14;
    if (pBVar14 == (Byte *)0x0) goto LAB_00708679;
  }
  pBVar14 = (Byte *)(ulong)p->NumFiles;
  SVar7 = SzBitUi32s_Alloc(&p->CRCs,(size_t)pBVar14,allocMain);
  if (SVar7 != 0) goto LAB_00708679;
  bVar30 = true;
  uVar28 = 0;
  if (local_148.sdCRCs.Size == 0) {
    pBVar17 = (Byte *)0x0;
    local_1b0 = (Byte *)0x0;
LAB_00708f2b:
    pCVar20 = (CSzData *)CONCAT71((int7)((ulong)pBVar14 >> 8),1);
    pBVar14 = pBVar17;
  }
  else {
    local_148.sdCRCs.Size = local_148.sdCRCs.Size - 1;
    pBVar17 = local_148.sdCRCs.Data + 1;
    if (*local_148.sdCRCs.Data == '\0') {
      local_1b0 = pBVar17 + (local_148.NumSubDigests + 7 >> 3);
      pBVar14 = pBVar17;
      local_148.sdCRCs.Data = pBVar17;
      goto LAB_00708f2b;
    }
    pCVar20 = (CSzData *)0x0;
    pBVar14 = (Byte *)0x0;
    local_1b0 = pBVar17;
    local_148.sdCRCs.Data = pBVar17;
  }
  if (local_1c8 == (UInt32 *)0x0) {
    UVar24 = 0;
    local_1a8 = local_1a8 & 0xffffffff00000000;
    local_1b8 = (CSzBitUi64s *)((ulong)local_1b8._4_4_ << 0x20);
    local_1e0 = (UInt32 *)0x0;
  }
  else {
    local_1e0 = (UInt32 *)0x0;
    uVar23 = (undefined3)((uint)in_R11D >> 8);
    bVar22 = 0x80;
    local_1bc = 0;
    uVar28 = 0;
    local_1b8 = (CSzBitUi64s *)((ulong)local_1b8._4_4_ << 0x20);
    uVar21 = 0;
    local_180 = local_180 & 0xffffffff00000000;
    UVar24 = 0;
    uVar16 = 0;
    local_178 = pCVar20;
    local_160 = pBVar14;
    do {
      if (bVar22 == 0) {
        uVar9 = (UInt32)local_1e0 - 1 >> 3;
        p->IsDirs[uVar9] = (Byte)uVar16;
        (p->CRCs).Defs[uVar9] = (Byte)local_1b8;
        bVar22 = 0x80;
        uVar16 = 0;
        local_1b8 = (CSzBitUi64s *)((ulong)local_1b8 & 0xffffffff00000000);
      }
      pUVar13 = p->UnpackPositions;
      pUVar13[(long)local_1e0] = UVar24;
      local_170 = (CSzBitUi64s *)(p->CRCs).Vals;
      *(undefined4 *)((long)&local_170->Defs + (long)local_1e0 * 4) = 0;
      local_190 = (CSzBitUi32s *)CONCAT71(local_190._1_7_,bVar22);
      bVar4 = (byte)local_1e0;
      if ((local_158 == (byte *)0x0) ||
         (-1 < (char)(local_158[(ulong)local_1e0 >> 3 & 0x1fffffff] << (bVar4 & 7)))) {
LAB_00709047:
        local_1a8 = CONCAT44(local_1a8._4_4_,uVar16);
        if (uVar21 == 0) {
          local_198 = pUVar13;
          if ((p->db).NumFolders <= (uint)uVar28) goto LAB_00709326;
          pUVar12 = p->FolderToFile;
          uVar28 = uVar28 & 0xffffffff;
          while( true ) {
            pUVar12[uVar28] = (UInt32)local_1e0;
            type_2._0_4_ = 1;
            if ((local_148.sdNumSubStreams.Data != (Byte *)0x0) &&
               (SVar7 = SzReadNumber32(&local_148.sdNumSubStreams,(UInt32 *)&type_2), SVar7 != 0))
            goto LAB_00708679;
            pUVar13 = local_198;
            uVar21 = (uint)type_2;
            if ((uint)type_2 != 0) break;
            puVar1 = (p->db).CoderUnpackSizes +
                     ((uint)(p->db).FoToMainUnpackSizeIndex[uVar28] +
                     (p->db).FoToCoderUnpackSizes[uVar28]);
            bVar30 = CARRY8(UVar24,*puVar1);
            UVar24 = UVar24 + *puVar1;
            SVar7 = 0x10;
            if (bVar30) goto LAB_00708679;
            uVar28 = uVar28 + 1;
            if ((p->db).NumFolders <= uVar28) goto LAB_00709326;
          }
        }
        p->FileToFolder[(long)local_1e0] = (UInt32)uVar28;
        if ((local_158 == (byte *)0x0) ||
           (-1 < (char)(local_158[(ulong)local_1e0 >> 3 & 0x1fffffff] << (bVar4 & 7)))) {
          uVar21 = uVar21 - 1;
          if (uVar21 == 0) {
            uVar18 = uVar28 & 0xffffffff;
            uVar25 = (p->db).CoderUnpackSizes
                     [(uint)(p->db).FoToMainUnpackSizeIndex[uVar18] +
                      (p->db).FoToCoderUnpackSizes[uVar18]];
            uVar3 = pUVar13[p->FolderToFile[uVar18]];
            if ((uVar25 < UVar24 - uVar3) || (UVar24 = uVar3 + uVar25, CARRY8(uVar3,uVar25))) {
              bVar30 = false;
              SVar6 = 0x10;
            }
            else {
              if ((((uint)type_2 == 1) &&
                  (pBVar14 = (p->db).FolderCRCs.Defs, pBVar14 != (Byte *)0x0)) &&
                 ((char)(pBVar14[(ulong)local_1e0 >> 3 & 0x1fffffff] << (bVar4 & 7)) < '\0')) {
                *(UInt32 *)((long)&local_170->Defs + (long)local_1e0 * 4) =
                     (p->db).FolderCRCs.Vals[uVar18];
LAB_007092d5:
                local_1b8 = (CSzBitUi64s *)
                            CONCAT44(local_1b8._4_4_,
                                     CONCAT31((int3)((ulong)local_1b8 >> 8),
                                              (byte)local_1b8 | (byte)local_190));
              }
              else if (((char)local_178 == '\0') ||
                      ((local_160 != (Byte *)0x0 && ((char)*local_160 < '\0')))) {
                *(undefined4 *)((long)&local_170->Defs + (long)local_1e0 * 4) =
                     *(undefined4 *)(local_1b0 + (local_180 & 0xffffffff) * 4);
                local_180 = CONCAT44(local_180._4_4_,(int)local_180 + 1);
                goto LAB_007092d5;
              }
              uVar28 = (ulong)((UInt32)uVar28 + 1);
              bVar30 = true;
            }
            uVar21 = 0;
          }
          else {
            SVar7 = ReadNumber(&local_148.sdSizes,&type_1);
            if (SVar7 == 0) {
              bVar30 = CARRY8(UVar24,type_1);
              UVar24 = UVar24 + type_1;
              if (bVar30) {
                bVar30 = false;
                SVar6 = 0x10;
              }
              else if (((char)local_178 == '\0') ||
                      ((bVar30 = true, local_160 != (Byte *)0x0 && ((char)*local_160 < '\0')))) {
                *(undefined4 *)((long)&local_170->Defs + (long)local_1e0 * 4) =
                     *(undefined4 *)(local_1b0 + (local_180 & 0xffffffff) * 4);
                local_180 = CONCAT44(local_180._4_4_,(int)local_180 + 1);
                local_1b8 = (CSzBitUi64s *)
                            CONCAT44(local_1b8._4_4_,
                                     CONCAT31((int3)((ulong)local_1b8 >> 8),
                                              (byte)local_1b8 | (byte)local_190));
                bVar30 = true;
              }
            }
            else {
              bVar30 = false;
              SVar6 = SVar7;
            }
          }
          SVar7 = SVar6;
          if (!bVar30) goto LAB_00708679;
        }
      }
      else {
        uVar5 = uVar23;
        if (local_168 != (Byte *)0x0) {
          if ((char)(local_168[local_1bc >> 3] << ((byte)local_1bc & 7)) < '\0') {
            bVar22 = 0;
          }
          local_1bc = local_1bc + 1;
          uVar5 = 0;
        }
        uVar16 = CONCAT31(uVar5,bVar22 | (byte)uVar16);
        if (uVar21 != 0) goto LAB_00709047;
        local_1a8 = CONCAT44(local_1a8._4_4_,uVar16);
        p->FileToFolder[(long)local_1e0] = 0xffffffff;
        uVar21 = 0;
      }
      local_1e0 = (UInt32 *)((long)local_1e0 + 1);
      bVar22 = (byte)local_190 >> 1;
      uVar16 = (int)local_1a8;
    } while (local_1e0 != local_1c8);
    bVar30 = uVar21 == 0;
  }
  UVar15 = (UInt32)local_1e0;
  if (local_1c8 != (UInt32 *)0x0) {
    uVar21 = UVar15 - 1 >> 3;
    p->IsDirs[uVar21] = (Byte)local_1a8;
    (p->CRCs).Defs[uVar21] = (Byte)local_1b8;
  }
  p->UnpackPositions[(ulong)local_1e0 & 0xffffffff] = UVar24;
  iVar26 = 0x10;
  SVar7 = iVar26;
  if (bVar30) {
    local_1c8 = p->FolderToFile;
    uVar25 = uVar28 & 0xffffffff;
    local_1c8[uVar25] = UVar15;
    if ((uint)uVar28 < (p->db).NumFolders) {
      do {
        SVar7 = iVar26;
        if (((local_148.sdNumSubStreams.Data == (Byte *)0x0) ||
            (SVar7 = SzReadNumber32(&local_148.sdNumSubStreams,(UInt32 *)&type_2), SVar7 != 0)) ||
           (SVar7 = iVar26, (uint)type_2 != 0)) goto LAB_00708679;
        local_1c8[uVar25 + 1] = UVar15;
        uVar25 = uVar25 + 1;
      } while (uVar25 < (p->db).NumFolders);
    }
    SVar7 = (uint)(local_148.sdNumSubStreams.Size != 0 &&
                  local_148.sdNumSubStreams.Data != (Byte *)0x0) << 4;
  }
LAB_00708679:
  lVar27 = 0;
  do {
    Buf_Free((CBuf *)((long)&tempBufs[0].data + lVar27),allocTemp);
    lVar27 = lVar27 + 0x10;
  } while (lVar27 != 0x80);
  if ((SVar7 == 0) && (sd->Size != 0)) {
    SVar7 = 0xb;
  }
  return SVar7;
}

Assistant:

static SRes SzReadHeader(
    CSzArEx *p,
    CSzData *sd,
    ILookInStream *inStream,
    ISzAlloc *allocMain,
    ISzAlloc *allocTemp)
{
  UInt32 i;
  UInt32 numTempBufs = 0;
  SRes res;
  CBuf tempBufs[NUM_ADDITIONAL_STREAMS_MAX];

  for (i = 0; i < NUM_ADDITIONAL_STREAMS_MAX; i++)
    Buf_Init(tempBufs + i);
  
  res = SzReadHeader2(p, sd, inStream,
      tempBufs, &numTempBufs,
      allocMain, allocTemp);
  
  for (i = 0; i < NUM_ADDITIONAL_STREAMS_MAX; i++)
    Buf_Free(tempBufs + i, allocTemp);

  RINOK(res);

  if (sd->Size != 0)
    return SZ_ERROR_FAIL;

  return res;
}